

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckBlock
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  AActor *this;
  AActor *pAVar5;
  uint uVar6;
  uint val;
  int selector;
  char *pcVar7;
  AActor *origin;
  undefined4 uVar8;
  undefined4 uVar9;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  DVector3 local_70;
  DVector3 local_58;
  DVector2 local_40;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003f0aff;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f0aef:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f0aff:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1992,
                  "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003f0729;
    bVar4 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f0aff;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003f0aef;
LAB_003f0729:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f0bac:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1993,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar6 = param[1].field_0.i;
LAB_003f0783:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f0bcb:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1994,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    selector = param[2].field_0.i;
LAB_003f0792:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f0b7b:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1995,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar8 = (undefined4)*(undefined8 *)&param[3].field_0;
    uVar9 = (undefined4)((ulong)*(undefined8 *)&param[3].field_0 >> 0x20);
LAB_003f07a3:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f0b5c:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1996,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_98 = param[4].field_0.f;
LAB_003f07b4:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f0b3d:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1997,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_a0 = param[5].field_0.f;
LAB_003f07c5:
    local_90 = (double)CONCAT44(uVar9,uVar8);
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f0b1e:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1998,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f0bac;
    }
    uVar6 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003f0783;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f0bcb;
    }
    selector = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003f0792;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f0b7b;
    }
    local_90 = *(double *)&param[3].field_0;
    uVar8 = SUB84(local_90,0);
    uVar9 = (undefined4)((ulong)local_90 >> 0x20);
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003f07a3;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f0b5c;
    }
    local_98 = param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003f07b4;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f0b3d;
    }
    local_a0 = param[5].field_0.f;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003f07c5;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f0b1e;
    }
  }
  local_a8 = param[6].field_0.f;
  this = COPY_AAPTR(origin,selector);
  if (this == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x199f,
                    "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    val = 0;
    goto LAB_003f0a4b;
  }
  if ((uVar6 >> 8 & 1) == 0) {
    local_a8 = local_a8 + (origin->Angles).Yaw.Degrees;
  }
  local_58.X = (this->__Pos).X;
  local_58.Y = (this->__Pos).Y;
  dVar1 = (this->__Pos).Z;
  local_58.Z = dVar1;
  if ((char)uVar6 < '\0') {
    uVar8 = SUB84(local_90,0);
    uVar9 = (undefined4)((ulong)local_90 >> 0x20);
    local_70.Y = local_98;
    local_70.Z = local_a0;
  }
  else {
    dVar2 = fastsindeg(local_a8);
    dVar3 = fastcosdeg(local_a8);
    AActor::Vec3Offset(&local_70,this,local_98 * dVar2 + local_90 * dVar3,
                       local_90 * dVar2 - local_98 * dVar3,local_a0,false);
    uVar8 = SUB84(local_70.X,0);
    uVar9 = (undefined4)((ulong)local_70.X >> 0x20);
  }
  local_70.X = (double)CONCAT44(uVar9,uVar8);
  if ((uVar6 & 0x20) == 0) {
    AActor::SetOrigin(this,&local_70,true);
    bVar4 = P_TestMobjLocation(this);
    AActor::SetOrigin(this,&local_58,true);
    if (bVar4) {
LAB_003f0a34:
      if (numret < 1) {
        return 0;
      }
      val = 0;
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x19d1,
                      "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      goto LAB_003f0a4b;
    }
  }
  else {
    (this->__Pos).Z = local_70.Z;
    local_40.X = (double)CONCAT44(uVar9,uVar8);
    local_40.Y = local_70.Y;
    bVar4 = P_CheckMove(this,&local_40,((uVar6 & 0x40) >> 5) + (uVar6 & 1) * 4 + 1);
    (this->__Pos).Z = dVar1;
    if (bVar4) goto LAB_003f0a34;
  }
  if (this->BlockingMobj != (AActor *)0x0) {
    pAVar5 = this;
    if ((uVar6 & 0x10) == 0) {
      pAVar5 = origin;
    }
    if (pAVar5 != (AActor *)0x0) {
      if ((uVar6 & 2) != 0) {
        (pAVar5->target).field_0.p = this->BlockingMobj;
      }
      if ((uVar6 & 4) != 0) {
        (pAVar5->master).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)this->BlockingMobj
        ;
      }
      if ((uVar6 & 8) != 0) {
        (pAVar5->tracer).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)this->BlockingMobj
        ;
      }
    }
  }
  val = 1;
  if ((((uVar6 & 0x40) != 0) || (this->BlockingMobj == (AActor *)0x0)) &&
     (((uVar6 & 1) != 0 || (this->BlockingLine == (line_t *)0x0)))) {
    val = (uVar6 & 0x20) >> 5;
  }
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x19e4,
                  "int AF_AActor_CheckBlock(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003f0a4b:
  VMReturn::SetInt(ret,val);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckBlock)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags)	
	PARAM_INT_DEF(ptr)		
	PARAM_FLOAT_DEF(xofs)	
	PARAM_FLOAT_DEF(yofs)	
	PARAM_FLOAT_DEF(zofs)	
	PARAM_ANGLE_DEF(angle)	

	AActor *mobj = COPY_AAPTR(self, ptr);

	//Needs at least one state jump to work. 
	if (!mobj)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (!(flags & CBF_ABSOLUTEANGLE))
	{
		angle += self->Angles.Yaw;
	}

	DVector3 oldpos = mobj->Pos();
	DVector3 pos;

	if (flags & CBF_ABSOLUTEPOS)
	{
		pos = { xofs, yofs, zofs };
	}
	else
	{
		double s = angle.Sin();
		double c = angle.Cos();
		pos = mobj->Vec3Offset(xofs * c + yofs * s, xofs * s - yofs * c, zofs);
	}
	
	// Next, try checking the position based on the sensitivity desired.
	// If checking for dropoffs, set the z so we can have maximum flexibility.
	// Otherwise, set origin and set it back after testing.

	bool checker = false;
	if (flags & CBF_DROPOFF)
	{
		// Unfortunately, whenever P_CheckMove returned false, that means it could
		// ignore a variety of flags mainly because of P_CheckPosition. This
		// results in picking up false positives due to actors or lines being in the way
		// when they clearly should not be.

		int fpass = PCM_DROPOFF;
		if (flags & CBF_NOACTORS)	fpass |= PCM_NOACTORS;
		if (flags & CBF_NOLINES)	fpass |= PCM_NOLINES;
		mobj->SetZ(pos.Z);
		checker = P_CheckMove(mobj, pos, fpass);
		mobj->SetZ(oldpos.Z);
	}
	else
	{
		mobj->SetOrigin(pos, true);
		checker = P_TestMobjLocation(mobj);
		mobj->SetOrigin(oldpos, true);
	}
	
	if (checker)
	{
		ACTION_RETURN_BOOL(false);
	}

	if (mobj->BlockingMobj)
	{
		AActor *setter = (flags & CBF_SETONPTR) ? mobj : self;
		if (setter)
		{
			if (flags & CBF_SETTARGET)	setter->target = mobj->BlockingMobj;
			if (flags & CBF_SETMASTER)	setter->master = mobj->BlockingMobj;
			if (flags & CBF_SETTRACER)	setter->tracer = mobj->BlockingMobj;
		}
	}

	//[MC] I don't know why I let myself be persuaded not to include a flag.
	//If an actor is loaded with pointers, they don't really have any options to spare.
	//Also, fail if a dropoff or a step is too great to pass over when checking for dropoffs.
	
	ACTION_RETURN_BOOL((!(flags & CBF_NOACTORS) && (mobj->BlockingMobj)) || (!(flags & CBF_NOLINES) && mobj->BlockingLine != NULL) ||
		((flags & CBF_DROPOFF) && !checker));
}